

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDataServerCommand.cpp
# Opt level: O0

double __thiscall OpenDataServerCommand::execute(OpenDataServerCommand *this)

{
  int iVar1;
  ostream *poVar2;
  thread local_48;
  thread data_server_thread;
  int clientLength;
  int socketfd;
  sockaddr_in client_adress;
  sockaddr_in serv_address;
  OpenDataServerCommand *this_local;
  
  memset(client_adress.sin_zero,0,0x10);
  memset(&clientLength,0,0x10);
  data_server_thread._M_id._M_thread._4_4_ = socket(2,1,0);
  if (data_server_thread._M_id._M_thread._4_4_ == -1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Could not create a socket");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local = (OpenDataServerCommand *)0xbff0000000000000;
  }
  else {
    memset(client_adress.sin_zero,0,0x10);
    client_adress.sin_zero[0] = '\x02';
    client_adress.sin_zero[1] = '\0';
    client_adress.sin_zero[4] = '\0';
    client_adress.sin_zero[5] = '\0';
    client_adress.sin_zero[6] = '\0';
    client_adress.sin_zero[7] = '\0';
    client_adress.sin_zero._2_2_ = htons(this->port);
    iVar1 = bind(data_server_thread._M_id._M_thread._4_4_,(sockaddr *)client_adress.sin_zero,0x10);
    if (iVar1 == -1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Could not bind the socket to an IP");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      this_local = (OpenDataServerCommand *)0xc000000000000000;
    }
    else {
      iVar1 = listen(data_server_thread._M_id._M_thread._4_4_,5);
      if (iVar1 == -1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Error during listening command");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        this_local = (OpenDataServerCommand *)0xc008000000000000;
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Server is now listening ...");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        data_server_thread._M_id._M_thread._0_4_ = 0x10;
        iVar1 = accept(data_server_thread._M_id._M_thread._4_4_,(sockaddr *)&clientLength,
                       (socklen_t *)&data_server_thread);
        this->client_socket = iVar1;
        this->client_socket_pointer = &this->client_socket;
        if (this->client_socket == -1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"Error accepting client");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          this_local = (OpenDataServerCommand *)0xc010000000000000;
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,"accepted ...");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          std::thread::thread<void*(&)(int*),int*&,void>
                    (&local_48,readFromServer,&this->client_socket_pointer);
          std::thread::detach();
          this_local = (OpenDataServerCommand *)0x0;
          std::thread::~thread(&local_48);
        }
      }
    }
  }
  return (double)this_local;
}

Assistant:

double OpenDataServerCommand::execute() {
  //create socket
  struct sockaddr_in serv_address{}, client_adress{};
  int socketfd = socket(AF_INET, SOCK_STREAM, 0);
  if (socketfd == -1) {
    //error
    cerr << "Could not create a socket" << endl;
    return -1;
  }
  
  //bind socket to IP address
  bzero((char *) &serv_address, sizeof(serv_address));
  serv_address.sin_family = AF_INET;
  serv_address.sin_addr.s_addr =
      INADDR_ANY; //give me any IP allocated for my machine
  serv_address.sin_port = htons(this->port);
  
  //the actual bind command
  if (bind(socketfd, (struct sockaddr *) &serv_address, sizeof(serv_address))
      == -1) {
    cerr << "Could not bind the socket to an IP" << endl;
    return -2;
  }

  //making socket listen to the port
  if (listen(socketfd, 5) == -1) {
    cerr << "Error during listening command" << endl;
    return -3;
  } else {
    cout << "Server is now listening ..." << endl;
  }

  // accepting a client
  int clientLength = sizeof(client_adress);
  this->client_socket = accept(socketfd, (struct sockaddr *) &client_adress,
                               (socklen_t *) &clientLength);
  this->client_socket_pointer = &client_socket;
  if (this->client_socket == -1) {
    cerr << "Error accepting client" << endl;
    return -4;
  } else {
    cout << "accepted ..." << endl;
  }
  // create the thread
  thread data_server_thread(readFromServer, client_socket_pointer);
  data_server_thread.detach();
  return 0;
}